

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

Vec_Int_t * Abc_BufSortByDelay(Buf_Man_t *p,int iPivot)

{
  Vec_Ptr_t *pVVar1;
  Abc_Obj_t *pObj;
  int Entry;
  int *__ptr;
  long lVar2;
  
  p->vDelays->nSize = 0;
  if ((-1 < iPivot) && (pVVar1 = p->pNtk->vObjs, iPivot < pVVar1->nSize)) {
    pObj = (Abc_Obj_t *)pVVar1->pArray[(uint)iPivot];
    if (0 < (pObj->vFanouts).nSize) {
      lVar2 = 0;
      do {
        Entry = Abc_BufEdgeSlack(p,pObj,(Abc_Obj_t *)
                                        pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]]);
        if (Entry < 0) {
          __assert_fail("Slack >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                        ,0x2ff,"Vec_Int_t *Abc_BufSortByDelay(Buf_Man_t *, int)");
        }
        Vec_IntPush(p->vDelays,Entry);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (pObj->vFanouts).nSize);
    }
    __ptr = Abc_QuickSortCost(p->vDelays->pArray,p->vDelays->nSize,0);
    p->vOrder->nSize = 0;
    if (0 < p->vDelays->nSize) {
      lVar2 = 0;
      do {
        Vec_IntPush(p->vOrder,
                    *(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[__ptr[lVar2]]]
                            + 0x10));
        lVar2 = lVar2 + 1;
      } while (lVar2 < p->vDelays->nSize);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    return p->vOrder;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Int_t * Abc_BufSortByDelay( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, Slack, * pOrder;
    Vec_IntClear( p->vDelays );
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack(p, pObj, pFanout);
        assert( Slack >= 0 );
        Vec_IntPush( p->vDelays, Abc_MaxInt(0, Slack) );
    }
    pOrder = Abc_QuickSortCost( Vec_IntArray(p->vDelays), Vec_IntSize(p->vDelays), 0 );
    Vec_IntClear( p->vOrder );
    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
        Vec_IntPush( p->vOrder, Abc_ObjId(Abc_ObjFanout(pObj, pOrder[i])) );
    ABC_FREE( pOrder );
//    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
//        printf( "%5d - %5d   ", Vec_IntEntry(p->vOrder, i), Abc_BufEdgeSlack(p, pObj, Abc_NtkObj(p->pNtk, Vec_IntEntry(p->vOrder, i))) );
    return p->vOrder;        
}